

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.cpp
# Opt level: O0

string * __thiscall indigox::Atom::GetName_abi_cxx11_(Atom *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI,(string *)(in_RSI + 0x48));
  return in_RDI;
}

Assistant:

String Atom::GetName() const { return name_; }